

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::~QNetworkReplyHttpImplPrivate(QNetworkReplyHttpImplPrivate *this)

{
  QNetworkReplyPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QNetworkReplyHttpImplPrivate_0049ecc8;
  QDecompressHelper::~QDecompressHelper((QDecompressHelper *)in_RDI);
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)in_RDI);
  QList<QSslError>::~QList((QList<QSslError> *)0x3164b3);
  QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::~QScopedPointer
            ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)in_RDI)
  ;
  std::shared_ptr<QAtomicInt>::~shared_ptr((shared_ptr<QAtomicInt> *)0x3164d5);
  std::shared_ptr<QAtomicInt>::~shared_ptr((shared_ptr<QAtomicInt> *)0x3164e6);
  QSharedPointer<char>::~QSharedPointer((QSharedPointer<char> *)0x3164f7);
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x316508);
  QUrl::~QUrl((QUrl *)&in_RDI[1].field_0xa8);
  std::shared_ptr<QRingBuffer>::~shared_ptr((shared_ptr<QRingBuffer> *)0x31652a);
  std::shared_ptr<QNonContiguousByteDevice>::~shared_ptr
            ((shared_ptr<QNonContiguousByteDevice> *)0x31653b);
  QString::~QString((QString *)0x31654c);
  QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)in_RDI);
  QNetworkReplyPrivate::~QNetworkReplyPrivate(in_RDI);
  return;
}

Assistant:

QNetworkReplyHttpImplPrivate::~QNetworkReplyHttpImplPrivate()
{
}